

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O0

bool duckdb::alp::AlpCompression<double,_true>::IsImpossibleToEncode(double n)

{
  bool bVar1;
  double in_XMM0_Qa;
  bool local_a;
  bool local_9;
  
  bVar1 = Value::IsFinite<double>(5.18074321241821e-317);
  local_9 = true;
  if (bVar1) {
    bVar1 = Value::IsNan<double>(5.180756058125e-317);
    local_9 = true;
    if (((!bVar1) && (local_9 = true, in_XMM0_Qa <= 9.223372036854775e+18)) &&
       (local_9 = true, -9.223372036854775e+18 <= in_XMM0_Qa)) {
      local_a = false;
      if ((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) {
        local_a = ::std::signbit(in_XMM0_Qa);
      }
      local_9 = local_a;
    }
  }
  return local_9;
}

Assistant:

static bool IsImpossibleToEncode(T n) {
		return !Value::IsFinite(n) || Value::IsNan(n) || n > AlpConstants::ENCODING_UPPER_LIMIT ||
		       n < AlpConstants::ENCODING_LOWER_LIMIT || (n == 0.0 && std::signbit(n)); //! Verification for -0.0
	}